

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O1

TValue * luaT_gettmbyobj(lua_State *L,TValue *o,TMS event)

{
  uint uVar1;
  Table **ppTVar2;
  TValue *pTVar3;
  
  uVar1 = o->tt_ & 0xf;
  if ((ulong)uVar1 == 7) {
    ppTVar2 = (Table **)((o->value_).f + 0x10);
  }
  else if (uVar1 == 5) {
    ppTVar2 = (Table **)((o->value_).f + 0x28);
  }
  else {
    ppTVar2 = L->l_G->mt + uVar1;
  }
  if (*ppTVar2 != (Table *)0x0) {
    pTVar3 = luaH_getshortstr(*ppTVar2,L->l_G->tmname[event]);
    return pTVar3;
  }
  return &luaO_nilobject_;
}

Assistant:

const TValue *luaT_gettmbyobj(lua_State *L, const TValue *o, TMS event) {
    Table *mt;
    switch (ttnov(o)) {
        case LUA_TTABLE:
            mt = hvalue(o)->metatable;
            break;
        case LUA_TUSERDATA:
            mt = uvalue(o)->metatable;
            break;
        default:
            mt = G(L)->mt[ttnov(o)];
    }
    return (mt ? luaH_getshortstr(mt, G(L)->tmname[event]) : luaO_nilobject);
}